

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O1

void __thiscall ApplicationContext::CreateCSP(ApplicationContext *this)

{
  char *src;
  size_t len;
  CSP *csp;
  thread local_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  anon_class_8_1_8991fb9c_for__M_head_impl local_18;
  
  src = csp_ac_src;
  len = strlen(csp_ac_src);
  csp = csp_parse((CSP *)0x0,src,len);
  this->csp = csp;
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter2.cpp:189:45)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter2.cpp:189:45)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  csp_bind_lambda(csp,"append_line",(function<void_(int)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter2.cpp:228:42)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter2.cpp:228:42)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  csp_bind_lambda(this->csp,"pop_line",(function<void_(int)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  local_78._8_8_ = 0;
  pcStack_60 = std::
               _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter2.cpp:239:38)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter2.cpp:239:38)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  csp_bind_lambda(this->csp,"tick",(function<void_(int)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  local_98._8_8_ = 0;
  pcStack_80 = std::
               _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter2.cpp:250:42)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter2.cpp:250:42)>
             ::_M_manager;
  local_98._M_unused._M_object = this;
  csp_bind_lambda(this->csp,"join_now",(function<void_(int)> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  local_18.this = this;
  std::thread::thread<ApplicationContext::CreateCSP()::_lambda()_1_,,void>(&local_a0,&local_18);
  if ((this->clock)._M_id._M_thread == 0) {
    (this->clock)._M_id._M_thread = (native_handle_type)local_a0._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

void CreateCSP()
    {
        csp = csp_parse(nullptr, csp_ac_src, strlen(csp_ac_src));

        csp_bind_lambda(csp, "append_line", [this](int id)
        {
            if (id)
            {
                ///>
                /// The append line event comes with a string to append,
                /// so fetch the data from the blackboard, and coerce it to be a string.
                /// If that works, append it to the lines buffer.
                ///<C++
                TypedData* d = blackboard_get(blackboard, id);
                auto td = dynamic_cast<Data<std::string>*>(d);
                if (td)
                {
                    ///>
                    /// append line must append the line.
                    ///<C++
                    lines.push_back(td->value());
                    ///>
                    /// The operation modified the ApplicationContext, so record the operation
                    /// in the journal. The journal will come in handy later during the discussion
                    /// of undo and redo. For now, the journal merely records what happened.
                    /// If a journal where to be played forward on another ApplicationContext,
                    /// the other ApplicationContext should achieve the identical state of the 
                    /// first ApplicationContext. Of course, in a large or long-running
                    /// application, it might be impractical to record every action; this
                    /// too will be a topic for a later chapter.
                    ///<C++
                    journal.emplace_back(std::move(JournalEntry{"append_line", d}));
                }
                else
                {
                    ///>
                    /// The data from the blackboard is not reference counted
                    /// so it must be deleted here.
                    ///<C++
                    delete d;
                }
            }
        });
        csp_bind_lambda(csp, "pop_line", [this](int)
        {
            if (lines.size())
            {
                lines.pop_back();
                journal.emplace_back(std::move(JournalEntry{"pop_line", nullptr}));
            }
        });
        ///>
        /// Whenever a tick occurs; the variable count will be incremented.
        ///<C++
        csp_bind_lambda(csp, "tick", [this](int)
        {
            ++count;
            ///>
            /// Ticking is not an action that was initiated by the user and doesn't
            /// need to appear in a journal.
            ///<C++
        });
        ///>
        /// The join_now action is here, bound by name to the csp QUIT process.
        ///<C++
        csp_bind_lambda(csp, "join_now", [this](int) { join_now = true; });
        ///>

        /// A demonstration thread that runs at 10Hz, emitting ticks as it goes.
        /// This shows a very simple way that threads can communicate.
        ///<C++
        clock = std::thread([this]()
        {
            while (!join_now)
            {
                csp_emit(csp, "tick", 0);
                std::this_thread::sleep_for(std::chrono::milliseconds(100));
            }
        });
    }